

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall
kws::Parser::IsBetweenSingleQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  string *in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  string stream;
  bool local_91;
  string local_48 [47];
  byte local_19;
  long local_18;
  bool local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_48,in_RCX);
  if (local_18 == -1) {
    local_1 = false;
    goto LAB_00139c71;
  }
  if (local_18 == 0) {
    local_1 = false;
    goto LAB_00139c71;
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (std::__cxx11::string::operator=(local_48,(string *)(in_RDI + 0x518)), (local_19 & 1) != 0)) {
    std::__cxx11::string::operator=(local_48,(string *)(in_RDI + 0x4f8));
  }
  if ((local_18 == 1) &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar2 != '\'')) {
    local_1 = false;
    goto LAB_00139c71;
  }
  lVar3 = std::__cxx11::string::length();
  if (local_18 == lVar3 + -1) {
    local_1 = false;
    goto LAB_00139c71;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
  if (*pcVar2 == '\'') {
LAB_00139c30:
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    local_91 = *pcVar2 == '\'';
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    local_91 = false;
    if (*pcVar2 == '\\') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      local_91 = false;
      if (*pcVar2 == '\'') goto LAB_00139c30;
    }
  }
  local_1 = local_91;
LAB_00139c71:
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::IsBetweenSingleQuote(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;

  if(pos == std::string::npos)
    {
    return false;
    }

  if(pos == 0)
    {
    return false;
    }

    if (buffer.empty()) {
      stream = m_BufferNoComment;
      if (withComments) {
        stream = m_Buffer;
      }
    }

  if(pos == 1 && stream[0] != '\'')
    {
    return false;
    }

  if(pos == stream.length()-1)
    {
    return false;
    }

  return ( ( stream[pos-1] == '\'' || ( stream[pos-1] == '\\' &&
       stream[pos-2] == '\'' ) ) && stream[pos+1] == '\'' );
}